

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O3

void av1_convolve_y_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_y,int32_t subpel_y_qn)

{
  int16_t *piVar1;
  undefined4 uVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  uint8_t *puVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  short *psVar14;
  undefined1 (*pauVar15) [32];
  uint *puVar16;
  ulong *puVar17;
  int iVar18;
  uint8_t *puVar19;
  undefined1 (*pauVar20) [32];
  uint uVar21;
  int32_t iVar22;
  long lVar23;
  undefined1 (*pauVar24) [32];
  undefined2 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  __m128i coeffs_1_2;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar47 [16];
  undefined1 auVar51 [32];
  undefined1 auVar56 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m128i coeffs_1_1;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  __m128i coeffs_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 local_1c8 [32];
  undefined1 local_178 [32];
  undefined1 local_f8 [32];
  undefined1 local_b8 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  undefined1 auVar41 [32];
  undefined1 auVar82 [32];
  undefined1 auVar95 [32];
  
  piVar1 = filter_params_y->filter_ptr;
  uVar9 = (ulong)((subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
  if (filter_params_y->taps == 0xc) {
    if (0 < w) {
      lVar12 = (long)(src_stride * 5);
      local_58._4_4_ = (undefined4)*(undefined8 *)(piVar1 + uVar9 + 8);
      uVar2 = (undefined4)((ulong)*(undefined8 *)(piVar1 + uVar9 + 8) >> 0x20);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50._16_4_ = uVar2;
      auVar50._20_4_ = uVar2;
      auVar50._24_4_ = uVar2;
      auVar50._28_4_ = uVar2;
      local_58._0_4_ = local_58._4_4_;
      local_58._8_4_ = local_58._4_4_;
      local_58._12_4_ = local_58._4_4_;
      local_58._16_4_ = local_58._4_4_;
      local_58._20_4_ = local_58._4_4_;
      local_58._24_4_ = local_58._4_4_;
      local_58._28_4_ = local_58._4_4_;
      local_f8._4_4_ = *(undefined4 *)(piVar1 + uVar9 + 6);
      local_f8._0_4_ = local_f8._4_4_;
      local_f8._8_4_ = local_f8._4_4_;
      local_f8._12_4_ = local_f8._4_4_;
      local_f8._16_4_ = local_f8._4_4_;
      local_f8._20_4_ = local_f8._4_4_;
      local_f8._24_4_ = local_f8._4_4_;
      local_f8._28_4_ = local_f8._4_4_;
      uVar2 = *(undefined4 *)(piVar1 + uVar9 + 4);
      auVar100 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      local_78._4_4_ = *(undefined4 *)(piVar1 + uVar9 + 2);
      local_78._0_4_ = local_78._4_4_;
      local_78._8_4_ = local_78._4_4_;
      local_78._12_4_ = local_78._4_4_;
      local_78._16_4_ = local_78._4_4_;
      local_78._20_4_ = local_78._4_4_;
      local_78._24_4_ = local_78._4_4_;
      local_78._28_4_ = local_78._4_4_;
      uVar2 = *(undefined4 *)(piVar1 + uVar9);
      auVar149._4_4_ = uVar2;
      auVar149._0_4_ = uVar2;
      auVar149._8_4_ = uVar2;
      auVar149._12_4_ = uVar2;
      auVar149._16_4_ = uVar2;
      auVar149._20_4_ = uVar2;
      auVar149._24_4_ = uVar2;
      auVar149._28_4_ = uVar2;
      lVar23 = (long)src_stride;
      lVar5 = (long)dst_stride;
      lVar11 = src_stride * 0xc - lVar12;
      lVar7 = src_stride * 0xb - lVar12;
      uVar9 = 0;
      do {
        if (0 < h) {
          lVar3 = uVar9 - lVar12;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(src + lVar23 * 9 + lVar3);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(src + lVar23 * 8 + lVar3);
          auVar51._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar67;
          auVar51._16_16_ = ZEXT116(1) * auVar26;
          auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar90 = vpunpcklbw_avx2(auVar51,auVar61);
          local_1c8._8_8_ = 0;
          local_1c8._0_8_ = *(ulong *)(src + lVar23 * 10 + lVar3);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(src + lVar23 * 10 + lVar3);
          auVar36._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar26;
          auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar94 = vpunpcklbw_avx2(auVar36,auVar61);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = *(ulong *)(src + lVar23 * 7 + lVar3);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(src + lVar23 * 6 + lVar3);
          auVar130._0_16_ = ZEXT116(0) * auVar119 + ZEXT116(1) * auVar27;
          auVar130._16_16_ = ZEXT116(1) * auVar119;
          auVar76._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar119;
          auVar76._16_16_ = ZEXT116(1) * auVar67;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = *(ulong *)(src + lVar12 + lVar3);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = *(ulong *)(src + lVar23 * 4 + lVar3);
          auVar140._0_16_ = ZEXT116(0) * auVar120 + ZEXT116(1) * auVar132;
          auVar140._16_16_ = ZEXT116(1) * auVar120;
          auVar123._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar120;
          auVar123._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(src + lVar23 * 3 + lVar3);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)(src + lVar23 * 2 + lVar3);
          auVar144._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar141;
          auVar144._16_16_ = ZEXT116(1) * auVar28;
          auVar134._0_16_ = ZEXT116(0) * auVar132 + ZEXT116(1) * auVar28;
          auVar134._16_16_ = ZEXT116(1) * auVar132;
          auVar147._8_8_ = 0;
          auVar147._0_8_ = *(ulong *)(src + lVar23 + lVar3);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(src + (uVar9 - lVar12));
          auVar150._0_16_ = ZEXT116(0) * auVar147 + ZEXT116(1) * auVar29;
          auVar150._16_16_ = ZEXT116(1) * auVar147;
          auVar142._0_16_ = ZEXT116(0) * auVar141 + ZEXT116(1) * auVar147;
          auVar142._16_16_ = ZEXT116(1) * auVar141;
          auVar53 = vpunpckhwd_avx2(auVar90,auVar94);
          auVar66 = vpunpcklbw_avx2(auVar130,auVar61);
          auVar78 = vpunpcklbw_avx2(auVar76,auVar61);
          auVar118 = vpunpcklwd_avx2(auVar90,auVar94);
          auVar90 = vpunpckhwd_avx2(auVar66,auVar78);
          auVar137 = vpunpcklbw_avx2(auVar140,auVar61);
          auVar39 = vpunpcklbw_avx2(auVar123,auVar61);
          auVar82 = vpunpcklwd_avx2(auVar66,auVar78);
          auVar94 = vpunpckhwd_avx2(auVar137,auVar39);
          auVar78 = vpunpcklbw_avx2(auVar144,auVar61);
          auVar127 = vpunpcklbw_avx2(auVar134,auVar61);
          auVar83 = vpunpcklwd_avx2(auVar137,auVar39);
          auVar66 = vpunpckhwd_avx2(auVar78,auVar127);
          auVar137 = vpunpcklbw_avx2(auVar150,auVar61);
          auVar39 = vpunpcklbw_avx2(auVar142,auVar61);
          auVar127 = vpunpcklwd_avx2(auVar78,auVar127);
          auVar78 = vpunpckhwd_avx2(auVar137,auVar39);
          auVar137 = vpunpcklwd_avx2(auVar137,auVar39);
          auVar46 = ZEXT116(0) * auVar118._0_16_ + ZEXT116(1) * local_1c8._0_16_;
          auVar56 = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * auVar118._0_16_;
          lVar13 = (uint)w - uVar9;
          lVar3 = 0;
          puVar6 = dst;
          puVar19 = src;
          do {
            auVar80 = auVar127;
            auVar127 = auVar83;
            auVar83 = auVar82;
            auVar117 = auVar90;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(puVar19 + lVar7);
            auVar62._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar46;
            auVar62._16_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar30;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)(puVar19 + lVar11);
            auVar37._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar30;
            auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47;
            auVar90 = vpunpcklbw_avx2(auVar62,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar39 = vpunpcklbw_avx2(auVar37,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar111 = vpunpcklwd_avx2(auVar90,auVar39);
            auVar61 = vpunpckhwd_avx2(auVar90,auVar39);
            auVar90 = vpmaddwd_avx2(auVar137,auVar149);
            auVar137 = vpmaddwd_avx2(auVar80,local_78);
            auVar90 = vpaddd_avx2(auVar137,auVar90);
            auVar82 = auVar100._0_32_;
            auVar137 = vpmaddwd_avx2(auVar127,auVar82);
            auVar39 = vpmaddwd_avx2(auVar83,local_f8);
            auVar137 = vpaddd_avx2(auVar137,auVar39);
            auVar90 = vpaddd_avx2(auVar90,auVar137);
            auVar137 = vpmaddwd_avx2(auVar118,local_58);
            auVar90 = vpaddd_avx2(auVar90,auVar137);
            auVar137 = vpmaddwd_avx2(auVar111,auVar50);
            auVar77._8_4_ = 0x40;
            auVar77._0_8_ = 0x4000000040;
            auVar77._12_4_ = 0x40;
            auVar77._16_4_ = 0x40;
            auVar77._20_4_ = 0x40;
            auVar77._24_4_ = 0x40;
            auVar77._28_4_ = 0x40;
            auVar90 = vpaddd_avx2(auVar90,auVar77);
            auVar90 = vpaddd_avx2(auVar137,auVar90);
            auVar90 = vpsrad_avx2(auVar90,7);
            auVar90 = vpackssdw_avx2(auVar90,auVar90);
            auVar90 = vpackuswb_avx2(auVar90,auVar90);
            if (lVar13 < 5) {
              if (lVar13 < 3) {
                vpextrw_avx(auVar90._0_16_,0);
                vpextrw_avx(auVar90._16_16_,0);
              }
              else {
                *(int *)puVar6 = auVar90._0_4_;
                *(int *)(puVar6 + lVar5) = auVar90._16_4_;
              }
            }
            else {
              auVar78 = vpmaddwd_avx2(auVar78,auVar149);
              auVar137 = vpmaddwd_avx2(local_78,auVar66);
              auVar78 = vpaddd_avx2(auVar137,auVar78);
              auVar137 = vpmaddwd_avx2(auVar94,auVar82);
              auVar39 = vpmaddwd_avx2(auVar117,local_f8);
              auVar137 = vpaddd_avx2(auVar137,auVar39);
              auVar78 = vpaddd_avx2(auVar78,auVar137);
              auVar137 = vpmaddwd_avx2(auVar53,local_58);
              auVar78 = vpaddd_avx2(auVar78,auVar137);
              auVar137 = vpmaddwd_avx2(auVar61,auVar50);
              auVar78 = vpaddd_avx2(auVar78,auVar77);
              auVar78 = vpaddd_avx2(auVar78,auVar137);
              auVar78 = vpsrad_avx2(auVar78,7);
              auVar78 = vpackssdw_avx2(auVar78,local_58);
              auVar78 = vpackuswb_avx2(auVar78,local_58);
              auVar90 = vpunpckldq_avx2(auVar90,auVar78);
              *(long *)puVar6 = auVar90._0_8_;
              *(long *)(puVar6 + lVar5) = auVar90._16_8_;
            }
            auVar100 = ZEXT3264(auVar82);
            auVar46 = ZEXT116(0) * auVar111._0_16_ + ZEXT116(1) * auVar47;
            auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar111._0_16_;
            lVar3 = lVar3 + 2;
            puVar6 = puVar6 + lVar5 * 2;
            puVar19 = puVar19 + lVar23 * 2;
            auVar90 = auVar53;
            auVar78 = auVar66;
            auVar82 = auVar118;
            auVar118 = auVar111;
            auVar53 = auVar61;
            auVar66 = auVar94;
            auVar94 = auVar117;
            auVar137 = auVar80;
          } while (lVar3 < h);
        }
        uVar9 = uVar9 + 8;
        dst = dst + 8;
        lVar11 = lVar11 + 8;
        lVar7 = lVar7 + 8;
      } while (uVar9 < (uint)w);
    }
  }
  else if (piVar1[uVar9 + 7] == 0 && piVar1[uVar9] == 0) {
    if (piVar1[uVar9 + 6] == 0 && piVar1[uVar9 + 1] == 0) {
      if (piVar1[uVar9 + 5] == 0 && piVar1[uVar9 + 2] == 0) {
        if (subpel_y_qn == 8) {
          if (w < 9) {
            if (w == 4) {
              uVar10 = *(uint *)src;
              do {
                uVar21 = *(uint *)(src + src_stride);
                auVar46 = vpavgb_avx(ZEXT416(uVar10),ZEXT416(uVar21));
                *(int *)dst = auVar46._0_4_;
                uVar10 = *(uint *)(src + src_stride * 2);
                src = src + src_stride * 2;
                auVar46 = vpavgb_avx(ZEXT416(uVar21),ZEXT416(uVar10));
                *(int *)(dst + dst_stride) = auVar46._0_4_;
                dst = dst + dst_stride * 2;
                h = h + -2;
              } while (h != 0);
            }
            else if (w == 2) {
              uVar10 = (uint)*(short *)src;
              do {
                auVar46 = vpavgb_avx(ZEXT416(uVar10),
                                     ZEXT416((uint)(int)*(short *)(src + src_stride)));
                vpextrw_avx(auVar46,0);
                uVar10 = (uint)*(short *)(src + src_stride * 2);
                auVar46 = vpavgb_avx(ZEXT416((uint)(int)*(short *)(src + src_stride)),
                                     ZEXT416(uVar10));
                vpextrw_avx(auVar46,0);
                src = src + src_stride * 2;
                h = h + -2;
              } while (h != 0);
            }
            else {
              uVar9 = *(ulong *)src;
              do {
                auVar46._8_8_ = 0;
                auVar46._0_8_ = uVar9;
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(ulong *)(src + src_stride);
                auVar46 = vpavgb_avx(auVar46,auVar49);
                *(long *)dst = auVar46._0_8_;
                uVar9 = *(ulong *)(src + src_stride * 2);
                src = src + src_stride * 2;
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar9;
                auVar46 = vpavgb_avx(auVar49,auVar35);
                *(long *)(dst + dst_stride) = auVar46._0_8_;
                dst = dst + dst_stride * 2;
                h = h + -2;
              } while (h != 0);
            }
          }
          else if (w == 0x40) {
            auVar53 = *(undefined1 (*) [32])src;
            auVar90 = *(undefined1 (*) [32])(src + 0x20);
            puVar6 = src + 0x20;
            lVar7 = (long)src_stride;
            lVar5 = lVar7 * 2;
            pauVar15 = (undefined1 (*) [32])(dst + 0x20);
            do {
              auVar94 = *(undefined1 (*) [32])(puVar6 + lVar7 + -0x20);
              auVar53 = vpavgb_avx2(auVar53,auVar94);
              pauVar15[-1] = auVar53;
              auVar66 = *(undefined1 (*) [32])(puVar6 + lVar7);
              auVar53 = vpavgb_avx2(auVar90,auVar66);
              *pauVar15 = auVar53;
              auVar53 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x20);
              auVar90 = vpavgb_avx2(auVar94,auVar53);
              *(undefined1 (*) [32])(pauVar15[-1] + dst_stride) = auVar90;
              auVar90 = *(undefined1 (*) [32])(puVar6 + lVar5);
              puVar6 = puVar6 + lVar5;
              auVar94 = vpavgb_avx2(auVar66,auVar90);
              *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar94;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x20) {
            auVar53 = *(undefined1 (*) [32])src;
            do {
              auVar90 = *(undefined1 (*) [32])(src + src_stride);
              auVar53 = vpavgb_avx2(auVar53,auVar90);
              *(undefined1 (*) [32])dst = auVar53;
              auVar53 = *(undefined1 (*) [32])(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar90 = vpavgb_avx2(auVar90,auVar53);
              *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar90;
              dst = *(undefined1 (*) [32])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar46 = *(undefined1 (*) [16])src;
            do {
              auVar56 = *(undefined1 (*) [16])(src + src_stride);
              auVar46 = vpavgb_avx(auVar46,auVar56);
              *(undefined1 (*) [16])dst = auVar46;
              auVar46 = *(undefined1 (*) [16])(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar56 = vpavgb_avx(auVar56,auVar46);
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar56;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            auVar53 = *(undefined1 (*) [32])src;
            auVar90 = *(undefined1 (*) [32])(src + 0x20);
            auVar94 = *(undefined1 (*) [32])(src + 0x40);
            auVar66 = *(undefined1 (*) [32])(src + 0x60);
            puVar6 = src + 0x60;
            lVar7 = (long)src_stride;
            lVar5 = lVar7 * 2;
            pauVar15 = (undefined1 (*) [32])(dst + 0x60);
            do {
              auVar78 = *(undefined1 (*) [32])(puVar6 + lVar7 + -0x60);
              auVar53 = vpavgb_avx2(auVar53,auVar78);
              pauVar15[-3] = auVar53;
              auVar137 = *(undefined1 (*) [32])(puVar6 + lVar7 + -0x40);
              auVar53 = vpavgb_avx2(auVar90,auVar137);
              pauVar15[-2] = auVar53;
              auVar39 = *(undefined1 (*) [32])(puVar6 + lVar7 + -0x20);
              auVar53 = vpavgb_avx2(auVar94,auVar39);
              pauVar15[-1] = auVar53;
              auVar127 = *(undefined1 (*) [32])(puVar6 + lVar7);
              auVar53 = vpavgb_avx2(auVar66,auVar127);
              *pauVar15 = auVar53;
              auVar53 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x60);
              auVar90 = vpavgb_avx2(auVar78,auVar53);
              *(undefined1 (*) [32])(pauVar15[-3] + dst_stride) = auVar90;
              auVar90 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x40);
              auVar94 = vpavgb_avx2(auVar137,auVar90);
              *(undefined1 (*) [32])(pauVar15[-2] + dst_stride) = auVar94;
              auVar94 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x20);
              auVar66 = vpavgb_avx2(auVar39,auVar94);
              *(undefined1 (*) [32])(pauVar15[-1] + dst_stride) = auVar66;
              auVar66 = *(undefined1 (*) [32])(puVar6 + lVar5);
              puVar6 = puVar6 + lVar5;
              auVar78 = vpavgb_avx2(auVar127,auVar66);
              *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar78;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
        }
        else if (w < 9) {
          auVar46 = vpsrlw_avx(ZEXT416(*(uint *)(piVar1 + uVar9 + 3)),1);
          auVar46 = vpshufb_avx(auVar46,_DAT_0050d6a0);
          if (w == 4) {
            uVar10 = *(uint *)src;
            lVar5 = (long)src_stride;
            auVar56._8_2_ = 0x20;
            auVar56._0_8_ = 0x20002000200020;
            auVar56._10_2_ = 0x20;
            auVar56._12_2_ = 0x20;
            auVar56._14_2_ = 0x20;
            do {
              auVar75 = vpinsrd_avx(ZEXT416(uVar10),*(uint *)(src + lVar5),1);
              uVar10 = *(uint *)(src + lVar5 * 2);
              auVar112 = vpinsrd_avx(ZEXT416(*(uint *)(src + lVar5)),
                                     *(undefined4 *)(src + lVar5 * 2),1);
              auVar75 = vpunpcklbw_avx(auVar75,auVar112);
              auVar75 = vpmaddubsw_avx(auVar75,auVar46);
              auVar75 = vpaddw_avx(auVar75,auVar56);
              auVar75 = vpsraw_avx(auVar75,6);
              auVar75 = vpackuswb_avx(auVar75,auVar75);
              *(int *)dst = auVar75._0_4_;
              iVar18 = vpextrw_avx(auVar75,3);
              uVar21 = vpextrw_avx(auVar75,2);
              *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
              src = src + src_stride * 2;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 2) {
            uVar10 = (uint)*(short *)src;
            auVar57._8_2_ = 0x20;
            auVar57._0_8_ = 0x20002000200020;
            auVar57._10_2_ = 0x20;
            auVar57._12_2_ = 0x20;
            auVar57._14_2_ = 0x20;
            do {
              auVar56 = vpunpcklwd_avx(ZEXT416(uVar10),
                                       ZEXT416((uint)(int)*(short *)(src + src_stride)));
              uVar10 = (uint)*(short *)(src + (long)src_stride * 2);
              auVar75 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(src + src_stride)),
                                       ZEXT416(uVar10));
              auVar56 = vpunpcklbw_avx(auVar56,auVar75);
              auVar56 = vpmaddubsw_avx(auVar56,auVar46);
              auVar56 = vpaddw_avx(auVar56,auVar57);
              auVar56 = vpsraw_avx(auVar56,6);
              auVar56 = vpackuswb_avx(auVar56,auVar56);
              vpextrw_avx(auVar56,0);
              vpextrw_avx(auVar56,1);
              src = src + src_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            uVar9 = *(ulong *)src;
            iVar18 = src_stride * 2;
            auVar75._8_2_ = 0x20;
            auVar75._0_8_ = 0x20002000200020;
            auVar75._10_2_ = 0x20;
            auVar75._12_2_ = 0x20;
            auVar75._14_2_ = 0x20;
            do {
              auVar112._8_8_ = 0;
              auVar112._0_8_ = uVar9;
              auVar56 = vpinsrq_avx(auVar112,*(ulong *)(src + src_stride),1);
              auVar129._8_8_ = 0;
              auVar129._0_8_ = *(ulong *)(src + src_stride);
              auVar129 = vpunpcklbw_avx(auVar112,auVar129);
              uVar9 = *(ulong *)(src + iVar18);
              auVar133._8_8_ = *(undefined8 *)(src + iVar18);
              auVar133._0_8_ = *(undefined8 *)(src + iVar18);
              src = src + iVar18;
              auVar112 = vpunpckhbw_avx(auVar56,auVar133);
              auVar56 = vpmaddubsw_avx(auVar129,auVar46);
              auVar112 = vpmaddubsw_avx(auVar112,auVar46);
              auVar56 = vpaddw_avx(auVar56,auVar75);
              auVar56 = vpsraw_avx(auVar56,6);
              auVar56 = vpackuswb_avx(auVar56,auVar56);
              auVar112 = vpaddw_avx(auVar112,auVar75);
              auVar112 = vpsraw_avx(auVar112,6);
              auVar112 = vpackuswb_avx(auVar112,auVar112);
              *(long *)dst = auVar56._0_8_;
              *(long *)(dst + dst_stride) = auVar112._0_8_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
        }
        else {
          auVar46 = ZEXT416(*(uint *)(piVar1 + uVar9 + 3));
          auVar53._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar46;
          auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
          auVar53 = vpsrlw_avx2(auVar53,1);
          auVar53 = vpshufb_avx2(auVar53,_DAT_00561f20);
          if (w == 0x40) {
            auVar94 = *(undefined1 (*) [32])src;
            auVar90 = *(undefined1 (*) [32])(src + 0x20);
            puVar6 = src + 0x20;
            lVar5 = (long)(src_stride * 2);
            pauVar15 = (undefined1 (*) [32])(dst + 0x20);
            auVar66._8_2_ = 0x20;
            auVar66._0_8_ = 0x20002000200020;
            auVar66._10_2_ = 0x20;
            auVar66._12_2_ = 0x20;
            auVar66._14_2_ = 0x20;
            auVar66._16_2_ = 0x20;
            auVar66._18_2_ = 0x20;
            auVar66._20_2_ = 0x20;
            auVar66._22_2_ = 0x20;
            auVar66._24_2_ = 0x20;
            auVar66._26_2_ = 0x20;
            auVar66._28_2_ = 0x20;
            auVar66._30_2_ = 0x20;
            do {
              auVar78 = *(undefined1 (*) [32])(puVar6 + (long)src_stride + -0x20);
              auVar39 = vpunpcklbw_avx2(auVar94,auVar78);
              auVar137 = vpunpckhbw_avx2(auVar94,auVar78);
              auVar94 = vpmaddubsw_avx2(auVar39,auVar53);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar66);
              auVar39 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar137,auVar66);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar39,auVar94);
              pauVar15[-1] = auVar94;
              auVar137 = *(undefined1 (*) [32])(puVar6 + src_stride);
              auVar39 = vpunpcklbw_avx2(auVar90,auVar137);
              auVar94 = vpunpckhbw_avx2(auVar90,auVar137);
              auVar90 = vpmaddubsw_avx2(auVar39,auVar53);
              auVar94 = vpmaddubsw_avx2(auVar94,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar66);
              auVar39 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar94,auVar66);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar39,auVar90);
              *pauVar15 = auVar90;
              auVar94 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x20);
              auVar90 = vpunpcklbw_avx2(auVar78,auVar94);
              auVar78 = vpunpckhbw_avx2(auVar78,auVar94);
              auVar90 = vpmaddubsw_avx2(auVar90,auVar53);
              auVar78 = vpmaddubsw_avx2(auVar78,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar66);
              auVar39 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar78,auVar66);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar39,auVar90);
              *(undefined1 (*) [32])(pauVar15[-1] + dst_stride) = auVar90;
              auVar90 = *(undefined1 (*) [32])(puVar6 + lVar5);
              puVar6 = puVar6 + lVar5;
              auVar78 = vpunpcklbw_avx2(auVar137,auVar90);
              auVar137 = vpunpckhbw_avx2(auVar137,auVar90);
              auVar78 = vpmaddubsw_avx2(auVar78,auVar53);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar53);
              auVar78 = vpaddw_avx2(auVar78,auVar66);
              auVar39 = vpsraw_avx2(auVar78,6);
              auVar78 = vpaddw_avx2(auVar137,auVar66);
              auVar78 = vpsraw_avx2(auVar78,6);
              auVar78 = vpackuswb_avx2(auVar39,auVar78);
              *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar78;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x20) {
            auVar90 = *(undefined1 (*) [32])src;
            auVar94._8_2_ = 0x20;
            auVar94._0_8_ = 0x20002000200020;
            auVar94._10_2_ = 0x20;
            auVar94._12_2_ = 0x20;
            auVar94._14_2_ = 0x20;
            auVar94._16_2_ = 0x20;
            auVar94._18_2_ = 0x20;
            auVar94._20_2_ = 0x20;
            auVar94._22_2_ = 0x20;
            auVar94._24_2_ = 0x20;
            auVar94._26_2_ = 0x20;
            auVar94._28_2_ = 0x20;
            auVar94._30_2_ = 0x20;
            do {
              auVar66 = *(undefined1 (*) [32])(src + src_stride);
              auVar137 = vpunpcklbw_avx2(auVar90,auVar66);
              auVar78 = vpunpckhbw_avx2(auVar90,auVar66);
              auVar90 = vpmaddubsw_avx2(auVar137,auVar53);
              auVar78 = vpmaddubsw_avx2(auVar78,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar94);
              auVar137 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar78,auVar94);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar137,auVar90);
              *(undefined1 (*) [32])dst = auVar90;
              auVar90 = *(undefined1 (*) [32])(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar137 = vpunpcklbw_avx2(auVar66,auVar90);
              auVar78 = vpunpckhbw_avx2(auVar66,auVar90);
              auVar66 = vpmaddubsw_avx2(auVar137,auVar53);
              auVar78 = vpmaddubsw_avx2(auVar78,auVar53);
              auVar66 = vpaddw_avx2(auVar66,auVar94);
              auVar137 = vpsraw_avx2(auVar66,6);
              auVar66 = vpaddw_avx2(auVar78,auVar94);
              auVar66 = vpsraw_avx2(auVar66,6);
              auVar66 = vpackuswb_avx2(auVar137,auVar66);
              *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar66;
              dst = *(undefined1 (*) [32])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar46 = *(undefined1 (*) [16])src;
            auVar90._8_2_ = 0x20;
            auVar90._0_8_ = 0x20002000200020;
            auVar90._10_2_ = 0x20;
            auVar90._12_2_ = 0x20;
            auVar90._14_2_ = 0x20;
            auVar90._16_2_ = 0x20;
            auVar90._18_2_ = 0x20;
            auVar90._20_2_ = 0x20;
            auVar90._22_2_ = 0x20;
            auVar90._24_2_ = 0x20;
            auVar90._26_2_ = 0x20;
            auVar90._28_2_ = 0x20;
            auVar90._30_2_ = 0x20;
            do {
              auVar56 = *(undefined1 (*) [16])(src + src_stride);
              auVar39._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar46;
              auVar39._16_16_ = ZEXT116(1) * auVar56;
              auVar46 = *(undefined1 (*) [16])(src + (long)src_stride * 2);
              auVar78._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar56;
              auVar78._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46
              ;
              auVar94 = vpunpcklbw_avx2(auVar39,auVar78);
              auVar66 = vpunpckhbw_avx2(auVar39,auVar78);
              auVar94 = vpmaddubsw_avx2(auVar94,auVar53);
              auVar66 = vpmaddubsw_avx2(auVar66,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar90);
              auVar78 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar66,auVar90);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar78,auVar94);
              *(undefined1 (*) [16])dst = auVar94._0_16_;
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar94._16_16_;
              src = src + src_stride * 2;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            auVar94 = *(undefined1 (*) [32])src;
            auVar66 = *(undefined1 (*) [32])(src + 0x20);
            auVar78 = *(undefined1 (*) [32])(src + 0x40);
            auVar90 = *(undefined1 (*) [32])(src + 0x60);
            puVar6 = src + 0x60;
            lVar5 = (long)(src_stride * 2);
            pauVar15 = (undefined1 (*) [32])(dst + 0x60);
            auVar137._8_2_ = 0x20;
            auVar137._0_8_ = 0x20002000200020;
            auVar137._10_2_ = 0x20;
            auVar137._12_2_ = 0x20;
            auVar137._14_2_ = 0x20;
            auVar137._16_2_ = 0x20;
            auVar137._18_2_ = 0x20;
            auVar137._20_2_ = 0x20;
            auVar137._22_2_ = 0x20;
            auVar137._24_2_ = 0x20;
            auVar137._26_2_ = 0x20;
            auVar137._28_2_ = 0x20;
            auVar137._30_2_ = 0x20;
            do {
              auVar39 = *(undefined1 (*) [32])(puVar6 + (long)src_stride + -0x60);
              auVar118 = vpunpcklbw_avx2(auVar94,auVar39);
              auVar127 = vpunpckhbw_avx2(auVar94,auVar39);
              auVar94 = vpmaddubsw_avx2(auVar118,auVar53);
              auVar127 = vpmaddubsw_avx2(auVar127,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar137);
              auVar118 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar127,auVar137);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar118,auVar94);
              pauVar15[-3] = auVar94;
              auVar127 = *(undefined1 (*) [32])(puVar6 + (long)src_stride + -0x40);
              auVar94 = vpunpcklbw_avx2(auVar66,auVar127);
              auVar66 = vpunpckhbw_avx2(auVar66,auVar127);
              auVar94 = vpmaddubsw_avx2(auVar94,auVar53);
              auVar66 = vpmaddubsw_avx2(auVar66,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar137);
              auVar118 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar66,auVar137);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar118,auVar94);
              pauVar15[-2] = auVar94;
              auVar118 = *(undefined1 (*) [32])(puVar6 + (long)src_stride + -0x20);
              auVar94 = vpunpcklbw_avx2(auVar78,auVar118);
              auVar66 = vpunpckhbw_avx2(auVar78,auVar118);
              auVar94 = vpmaddubsw_avx2(auVar94,auVar53);
              auVar66 = vpmaddubsw_avx2(auVar66,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar137);
              auVar78 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar66,auVar137);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar78,auVar94);
              pauVar15[-1] = auVar94;
              auVar82 = *(undefined1 (*) [32])(puVar6 + src_stride);
              auVar66 = vpunpcklbw_avx2(auVar90,auVar82);
              auVar94 = vpunpckhbw_avx2(auVar90,auVar82);
              auVar90 = vpmaddubsw_avx2(auVar66,auVar53);
              auVar94 = vpmaddubsw_avx2(auVar94,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar137);
              auVar66 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar94,auVar137);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar66,auVar90);
              *pauVar15 = auVar90;
              auVar94 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x60);
              auVar90 = vpunpcklbw_avx2(auVar39,auVar94);
              auVar66 = vpunpckhbw_avx2(auVar39,auVar94);
              auVar90 = vpmaddubsw_avx2(auVar90,auVar53);
              auVar66 = vpmaddubsw_avx2(auVar66,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar137);
              auVar78 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar66,auVar137);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar78,auVar90);
              *(undefined1 (*) [32])(pauVar15[-3] + dst_stride) = auVar90;
              auVar66 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x40);
              auVar90 = vpunpcklbw_avx2(auVar127,auVar66);
              auVar78 = vpunpckhbw_avx2(auVar127,auVar66);
              auVar90 = vpmaddubsw_avx2(auVar90,auVar53);
              auVar78 = vpmaddubsw_avx2(auVar78,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar137);
              auVar39 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar78,auVar137);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar39,auVar90);
              *(undefined1 (*) [32])(pauVar15[-2] + dst_stride) = auVar90;
              auVar78 = *(undefined1 (*) [32])(puVar6 + lVar5 + -0x20);
              auVar90 = vpunpcklbw_avx2(auVar118,auVar78);
              auVar39 = vpunpckhbw_avx2(auVar118,auVar78);
              auVar90 = vpmaddubsw_avx2(auVar90,auVar53);
              auVar39 = vpmaddubsw_avx2(auVar39,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar137);
              auVar127 = vpsraw_avx2(auVar90,6);
              auVar90 = vpaddw_avx2(auVar39,auVar137);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar127,auVar90);
              *(undefined1 (*) [32])(pauVar15[-1] + dst_stride) = auVar90;
              auVar90 = *(undefined1 (*) [32])(puVar6 + lVar5);
              puVar6 = puVar6 + lVar5;
              auVar39 = vpunpcklbw_avx2(auVar82,auVar90);
              auVar127 = vpunpckhbw_avx2(auVar82,auVar90);
              auVar39 = vpmaddubsw_avx2(auVar39,auVar53);
              auVar127 = vpmaddubsw_avx2(auVar127,auVar53);
              auVar39 = vpaddw_avx2(auVar39,auVar137);
              auVar118 = vpsraw_avx2(auVar39,6);
              auVar39 = vpaddw_avx2(auVar127,auVar137);
              auVar39 = vpsraw_avx2(auVar39,6);
              auVar39 = vpackuswb_avx2(auVar118,auVar39);
              *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar39;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
        }
      }
      else {
        lVar5 = (long)src_stride;
        pauVar15 = (undefined1 (*) [32])(src + -lVar5);
        auVar46 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar9),1);
        if (w < 5) {
          auVar56 = vpshufb_avx(auVar46,_DAT_0050d6f0);
          auVar46 = vpshufb_avx(auVar46,_DAT_0050d6c0);
          if (w == 2) {
            uVar10 = (uint)*(short *)(*pauVar15 + lVar5 * 2);
            auVar75 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar15),
                                     ZEXT416((uint)(int)*(short *)src));
            auVar112 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),ZEXT416(uVar10));
            auVar75 = vpunpcklbw_avx(auVar75,auVar112);
            psVar14 = (short *)(src + lVar5 * 2);
            auVar68._8_2_ = 0x20;
            auVar68._0_8_ = 0x20002000200020;
            auVar68._10_2_ = 0x20;
            auVar68._12_2_ = 0x20;
            auVar68._14_2_ = 0x20;
            do {
              auVar129 = vpunpcklwd_avx(ZEXT416(uVar10),ZEXT416((uint)(int)*psVar14));
              uVar10 = (uint)*(short *)((long)psVar14 + lVar5);
              auVar133 = vpunpcklwd_avx(ZEXT416((uint)(int)*psVar14),ZEXT416(uVar10));
              auVar112 = vpmaddubsw_avx(auVar75,auVar56);
              auVar75 = vpunpcklbw_avx(auVar129,auVar133);
              auVar112 = vpaddw_avx(auVar112,auVar68);
              auVar129 = vpmaddubsw_avx(auVar75,auVar46);
              auVar112 = vpaddw_avx(auVar112,auVar129);
              auVar112 = vpsraw_avx(auVar112,6);
              auVar112 = vpackuswb_avx(auVar112,auVar112);
              vpextrw_avx(auVar112,0);
              vpextrw_avx(auVar112,1);
              psVar14 = psVar14 + lVar5;
              h = h + -2;
            } while (h != 0);
          }
          else {
            auVar75 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar15),*(uint *)src,1);
            auVar112 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)(*pauVar15 + lVar5 * 2),1);
            uVar10 = *(uint *)(*pauVar15 + lVar5 * 2);
            auVar75 = vpunpcklbw_avx(auVar75,auVar112);
            puVar16 = (uint *)(src + lVar5 * 2);
            auVar73._8_2_ = 0x20;
            auVar73._0_8_ = 0x20002000200020;
            auVar73._10_2_ = 0x20;
            auVar73._12_2_ = 0x20;
            auVar73._14_2_ = 0x20;
            do {
              auVar112 = vpinsrd_avx(ZEXT416(uVar10),*puVar16,1);
              auVar129 = vpinsrd_avx(ZEXT416(*puVar16),*(undefined4 *)((long)puVar16 + lVar5),1);
              uVar10 = *(uint *)((long)puVar16 + lVar5);
              auVar133 = vpmaddubsw_avx(auVar75,auVar56);
              auVar75 = vpunpcklbw_avx(auVar112,auVar129);
              auVar112 = vpaddw_avx(auVar133,auVar73);
              auVar129 = vpmaddubsw_avx(auVar75,auVar46);
              auVar112 = vpaddw_avx(auVar112,auVar129);
              auVar112 = vpsraw_avx(auVar112,6);
              auVar112 = vpackuswb_avx(auVar112,auVar112);
              *(int *)dst = auVar112._0_4_;
              iVar18 = vpextrw_avx(auVar112,3);
              uVar21 = vpextrw_avx(auVar112,2);
              *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
              dst = dst + dst_stride * 2;
              puVar16 = (uint *)((long)puVar16 + lVar5 * 2);
              h = h + -2;
            } while (h != 0);
          }
        }
        else {
          auVar56 = vpshufb_avx(auVar46,_DAT_00561f60);
          auVar127._0_2_ = auVar56._0_2_;
          auVar127._2_2_ = auVar127._0_2_;
          auVar127._4_2_ = auVar127._0_2_;
          auVar127._6_2_ = auVar127._0_2_;
          auVar127._8_2_ = auVar127._0_2_;
          auVar127._10_2_ = auVar127._0_2_;
          auVar127._12_2_ = auVar127._0_2_;
          auVar127._14_2_ = auVar127._0_2_;
          auVar127._16_2_ = auVar127._0_2_;
          auVar127._18_2_ = auVar127._0_2_;
          auVar127._20_2_ = auVar127._0_2_;
          auVar127._22_2_ = auVar127._0_2_;
          auVar127._24_2_ = auVar127._0_2_;
          auVar127._26_2_ = auVar127._0_2_;
          auVar127._28_2_ = auVar127._0_2_;
          auVar127._30_2_ = auVar127._0_2_;
          auVar46 = vpshufb_avx(auVar46,_DAT_00561f70);
          auVar118._0_2_ = auVar46._0_2_;
          auVar118._2_2_ = auVar118._0_2_;
          auVar118._4_2_ = auVar118._0_2_;
          auVar118._6_2_ = auVar118._0_2_;
          auVar118._8_2_ = auVar118._0_2_;
          auVar118._10_2_ = auVar118._0_2_;
          auVar118._12_2_ = auVar118._0_2_;
          auVar118._14_2_ = auVar118._0_2_;
          auVar118._16_2_ = auVar118._0_2_;
          auVar118._18_2_ = auVar118._0_2_;
          auVar118._20_2_ = auVar118._0_2_;
          auVar118._22_2_ = auVar118._0_2_;
          auVar118._24_2_ = auVar118._0_2_;
          auVar118._26_2_ = auVar118._0_2_;
          auVar118._28_2_ = auVar118._0_2_;
          auVar118._30_2_ = auVar118._0_2_;
          if (w == 8) {
            uVar9 = *(ulong *)(*pauVar15 + lVar5 * 2);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = *(ulong *)src;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)*pauVar15;
            auVar82._0_16_ = ZEXT116(0) * auVar89 + ZEXT116(1) * auVar74;
            auVar82._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = uVar9;
            auVar61._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar89;
            auVar61._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
            auVar53 = vpunpcklbw_avx2(auVar82,auVar61);
            puVar17 = (ulong *)(src + lVar5 * 2);
            auVar83._8_2_ = 0x20;
            auVar83._0_8_ = 0x20002000200020;
            auVar83._10_2_ = 0x20;
            auVar83._12_2_ = 0x20;
            auVar83._14_2_ = 0x20;
            auVar83._16_2_ = 0x20;
            auVar83._18_2_ = 0x20;
            auVar83._20_2_ = 0x20;
            auVar83._22_2_ = 0x20;
            auVar83._24_2_ = 0x20;
            auVar83._26_2_ = 0x20;
            auVar83._28_2_ = 0x20;
            auVar83._30_2_ = 0x20;
            do {
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *puVar17;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar9;
              auVar117._0_16_ = ZEXT116(0) * auVar105 + ZEXT116(1) * auVar59;
              auVar117._16_16_ = ZEXT116(1) * auVar105;
              uVar9 = *(ulong *)((long)puVar17 + lVar5);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar9;
              auVar111._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar105;
              auVar111._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
              auVar90 = vpmaddubsw_avx2(auVar53,auVar127);
              auVar53 = vpunpcklbw_avx2(auVar117,auVar111);
              auVar90 = vpaddw_avx2(auVar90,auVar83);
              auVar94 = vpmaddubsw_avx2(auVar53,auVar118);
              auVar90 = vpaddw_avx2(auVar90,auVar94);
              auVar90 = vpsraw_avx2(auVar90,6);
              auVar90 = vpackuswb_avx2(auVar90,auVar127);
              *(long *)dst = auVar90._0_8_;
              *(long *)(dst + dst_stride) = auVar90._16_8_;
              dst = dst + dst_stride * 2;
              puVar17 = (ulong *)((long)puVar17 + lVar5 * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar46 = *(undefined1 (*) [16])src;
            auVar56 = *(undefined1 (*) [16])(*pauVar15 + lVar5 * 2);
            auVar80._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * *(undefined1 (*) [16])*pauVar15;
            auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
            auVar99._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar46;
            auVar99._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
            auVar90 = vpunpcklbw_avx2(auVar80,auVar99);
            auVar53 = vpunpckhbw_avx2(auVar80,auVar99);
            pauVar4 = (undefined1 (*) [16])(src + lVar5 * 2);
            auVar81._8_2_ = 0x20;
            auVar81._0_8_ = 0x20002000200020;
            auVar81._10_2_ = 0x20;
            auVar81._12_2_ = 0x20;
            auVar81._14_2_ = 0x20;
            auVar81._16_2_ = 0x20;
            auVar81._18_2_ = 0x20;
            auVar81._20_2_ = 0x20;
            auVar81._22_2_ = 0x20;
            auVar81._24_2_ = 0x20;
            auVar81._26_2_ = 0x20;
            auVar81._28_2_ = 0x20;
            auVar81._30_2_ = 0x20;
            do {
              auVar46 = *pauVar4;
              auVar128._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar56;
              auVar128._16_16_ = ZEXT116(1) * auVar46;
              auVar56 = *(undefined1 (*) [16])(*pauVar4 + lVar5);
              auVar93._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar46;
              auVar93._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56
              ;
              auVar94 = vpmaddubsw_avx2(auVar90,auVar127);
              auVar90 = vpunpcklbw_avx2(auVar128,auVar93);
              auVar66 = vpmaddubsw_avx2(auVar53,auVar127);
              auVar53 = vpunpckhbw_avx2(auVar128,auVar93);
              auVar78 = vpmaddubsw_avx2(auVar90,auVar118);
              auVar137 = vpmaddubsw_avx2(auVar53,auVar118);
              auVar94 = vpaddw_avx2(auVar94,auVar81);
              auVar94 = vpaddw_avx2(auVar94,auVar78);
              auVar78 = vpsraw_avx2(auVar94,6);
              auVar94 = vpaddw_avx2(auVar66,auVar81);
              auVar94 = vpaddw_avx2(auVar137,auVar94);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar78,auVar94);
              *(undefined1 (*) [16])dst = auVar94._0_16_;
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar94._16_16_;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              pauVar4 = (undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x20) {
            auVar53 = *(undefined1 (*) [32])src;
            auVar90 = *(undefined1 (*) [32])(*pauVar15 + lVar5 * 2);
            auVar78 = vpunpcklbw_avx2(*pauVar15,auVar53);
            auVar94 = vpunpckhbw_avx2(*pauVar15,auVar53);
            auVar66 = vpunpcklbw_avx2(auVar53,auVar90);
            auVar53 = vpunpckhbw_avx2(auVar53,auVar90);
            pauVar15 = (undefined1 (*) [32])(src + lVar5 * 2);
            auVar79._8_2_ = 0x20;
            auVar79._0_8_ = 0x20002000200020;
            auVar79._10_2_ = 0x20;
            auVar79._12_2_ = 0x20;
            auVar79._14_2_ = 0x20;
            auVar79._16_2_ = 0x20;
            auVar79._18_2_ = 0x20;
            auVar79._20_2_ = 0x20;
            auVar79._22_2_ = 0x20;
            auVar79._24_2_ = 0x20;
            auVar79._26_2_ = 0x20;
            auVar79._28_2_ = 0x20;
            auVar79._30_2_ = 0x20;
            do {
              auVar137 = *pauVar15;
              auVar39 = vpmaddubsw_avx2(auVar78,auVar127);
              auVar78 = vpunpcklbw_avx2(auVar90,auVar137);
              auVar82 = vpmaddubsw_avx2(auVar94,auVar127);
              auVar94 = vpunpckhbw_avx2(auVar90,auVar137);
              auVar90 = *(undefined1 (*) [32])(*pauVar15 + lVar5);
              auVar83 = vpmaddubsw_avx2(auVar66,auVar127);
              auVar66 = vpunpcklbw_avx2(auVar137,auVar90);
              auVar61 = vpmaddubsw_avx2(auVar53,auVar127);
              auVar53 = vpunpckhbw_avx2(auVar137,auVar90);
              auVar111 = vpmaddubsw_avx2(auVar78,auVar118);
              auVar117 = vpmaddubsw_avx2(auVar94,auVar118);
              auVar80 = vpmaddubsw_avx2(auVar66,auVar118);
              auVar81 = vpmaddubsw_avx2(auVar53,auVar118);
              auVar137 = vpaddw_avx2(auVar39,auVar79);
              auVar137 = vpaddw_avx2(auVar137,auVar111);
              auVar39 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar82,auVar79);
              auVar137 = vpaddw_avx2(auVar137,auVar117);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar39,auVar137);
              *(undefined1 (*) [32])dst = auVar137;
              auVar137 = vpaddw_avx2(auVar83,auVar79);
              auVar137 = vpaddw_avx2(auVar80,auVar137);
              auVar39 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar61,auVar79);
              auVar137 = vpaddw_avx2(auVar81,auVar137);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar39,auVar137);
              *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar137;
              dst = *(undefined1 (*) [32])dst + dst_stride * 2;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar5 * 2);
              h = h + -2;
            } while (h != 0);
          }
          else {
            pauVar20 = (undefined1 (*) [32])(src + lVar5 * 2);
            uVar9 = 0;
            auVar65._8_2_ = 0x20;
            auVar65._0_8_ = 0x20002000200020;
            auVar65._10_2_ = 0x20;
            auVar65._12_2_ = 0x20;
            auVar65._14_2_ = 0x20;
            auVar65._16_2_ = 0x20;
            auVar65._18_2_ = 0x20;
            auVar65._20_2_ = 0x20;
            auVar65._22_2_ = 0x20;
            auVar65._24_2_ = 0x20;
            auVar65._26_2_ = 0x20;
            auVar65._28_2_ = 0x20;
            auVar65._30_2_ = 0x20;
            do {
              pauVar24 = (undefined1 (*) [32])(dst + uVar9);
              auVar53 = *(undefined1 (*) [32])(*pauVar15 + lVar5 + uVar9);
              auVar90 = *(undefined1 (*) [32])(*pauVar15 + lVar5 * 2 + uVar9);
              auVar78 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar15 + uVar9),auVar53);
              auVar94 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar15 + uVar9),auVar53);
              auVar66 = vpunpcklbw_avx2(auVar53,auVar90);
              auVar53 = vpunpckhbw_avx2(auVar53,auVar90);
              pauVar8 = pauVar20;
              iVar22 = h;
              do {
                auVar137 = *pauVar8;
                auVar39 = vpmaddubsw_avx2(auVar78,auVar127);
                auVar78 = vpunpcklbw_avx2(auVar90,auVar137);
                auVar82 = vpmaddubsw_avx2(auVar94,auVar127);
                auVar94 = vpunpckhbw_avx2(auVar90,auVar137);
                auVar90 = *(undefined1 (*) [32])(*pauVar8 + lVar5);
                auVar83 = vpmaddubsw_avx2(auVar66,auVar127);
                auVar66 = vpunpcklbw_avx2(auVar137,auVar90);
                auVar61 = vpmaddubsw_avx2(auVar53,auVar127);
                auVar53 = vpunpckhbw_avx2(auVar137,auVar90);
                auVar111 = vpmaddubsw_avx2(auVar78,auVar118);
                auVar117 = vpmaddubsw_avx2(auVar94,auVar118);
                auVar80 = vpmaddubsw_avx2(auVar66,auVar118);
                auVar81 = vpmaddubsw_avx2(auVar53,auVar118);
                auVar137 = vpaddw_avx2(auVar39,auVar65);
                auVar137 = vpaddw_avx2(auVar137,auVar111);
                auVar39 = vpsraw_avx2(auVar137,6);
                auVar137 = vpaddw_avx2(auVar82,auVar65);
                auVar137 = vpaddw_avx2(auVar137,auVar117);
                auVar137 = vpsraw_avx2(auVar137,6);
                auVar137 = vpackuswb_avx2(auVar39,auVar137);
                *pauVar24 = auVar137;
                auVar137 = vpaddw_avx2(auVar83,auVar65);
                auVar137 = vpaddw_avx2(auVar80,auVar137);
                auVar39 = vpsraw_avx2(auVar137,6);
                auVar137 = vpaddw_avx2(auVar61,auVar65);
                auVar137 = vpaddw_avx2(auVar81,auVar137);
                auVar137 = vpsraw_avx2(auVar137,6);
                auVar137 = vpackuswb_avx2(auVar39,auVar137);
                *(undefined1 (*) [32])(*pauVar24 + dst_stride) = auVar137;
                pauVar24 = (undefined1 (*) [32])(*pauVar24 + dst_stride * 2);
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar5 * 2);
                iVar22 = iVar22 + -2;
              } while (iVar22 != 0);
              uVar9 = uVar9 + 0x20;
              pauVar20 = pauVar20 + 1;
            } while (uVar9 < (uint)w);
          }
        }
      }
    }
    else {
      lVar5 = (long)(src_stride * 2);
      pauVar4 = (undefined1 (*) [16])(src + -lVar5);
      auVar46 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar9),1);
      if (w < 5) {
        auVar56 = vpshufb_avx(auVar46,_DAT_0055fe50);
        auVar75 = vpshufb_avx(auVar46,_DAT_0055fe60);
        auVar46 = vpshufb_avx(auVar46,_DAT_0055fe70);
        if (w == 2) {
          lVar7 = (long)src_stride;
          uVar10 = (uint)*(short *)(*pauVar4 + lVar7 * 4);
          auVar112 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar4),
                                    ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar7)));
          auVar129 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar7)),
                                    ZEXT416((uint)(int)*(short *)src));
          auVar112 = vpunpcklbw_avx(auVar112,auVar129);
          auVar129 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                    ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar7 * 3)));
          auVar133 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar7 * 3)),
                                    ZEXT416(uVar10));
          auVar129 = vpunpcklbw_avx(auVar129,auVar133);
          auVar101._8_2_ = 0x20;
          auVar101._0_8_ = 0x20002000200020;
          auVar101._10_2_ = 0x20;
          auVar101._12_2_ = 0x20;
          auVar101._14_2_ = 0x20;
          do {
            auVar35 = auVar129;
            auVar129 = vpunpcklwd_avx(ZEXT416(uVar10),
                                      ZEXT416((uint)(int)*(short *)(src + lVar7 * 3)));
            uVar10 = (uint)*(short *)(src + lVar7 * 4);
            auVar57 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(src + lVar7 * 3)),ZEXT416(uVar10)
                                    );
            auVar133 = vpmaddubsw_avx(auVar35,auVar75);
            auVar129 = vpunpcklbw_avx(auVar129,auVar57);
            auVar112 = vpmaddubsw_avx(auVar112,auVar56);
            auVar112 = vpaddw_avx(auVar133,auVar112);
            auVar112 = vpaddw_avx(auVar112,auVar101);
            auVar133 = vpmaddubsw_avx(auVar129,auVar46);
            auVar112 = vpaddw_avx(auVar133,auVar112);
            auVar112 = vpsraw_avx(auVar112,6);
            auVar112 = vpackuswb_avx(auVar112,auVar112);
            vpextrw_avx(auVar112,0);
            vpextrw_avx(auVar112,1);
            src = src + lVar5;
            h = h + -2;
            auVar112 = auVar35;
          } while (h != 0);
        }
        else {
          lVar7 = (long)src_stride;
          uVar10 = *(uint *)(*pauVar4 + lVar7 * 4);
          auVar112 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar4),*(uint *)(*pauVar4 + lVar7),1);
          auVar129 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar7)),*(uint *)src,1);
          auVar133 = vpunpcklbw_avx(auVar112,auVar129);
          auVar112 = vpinsrd_avx(ZEXT416(*(uint *)src),*(uint *)(*pauVar4 + lVar7 * 3),1);
          auVar129 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar7 * 3)),
                                 *(undefined4 *)(*pauVar4 + lVar7 * 4),1);
          auVar112 = vpunpcklbw_avx(auVar112,auVar129);
          auVar69._8_2_ = 0x20;
          auVar69._0_8_ = 0x20002000200020;
          auVar69._10_2_ = 0x20;
          auVar69._12_2_ = 0x20;
          auVar69._14_2_ = 0x20;
          do {
            auVar57 = vpmaddubsw_avx(auVar133,auVar56);
            auVar129 = vpinsrd_avx(ZEXT416(uVar10),*(uint *)(src + lVar7 * 3),1);
            auVar133 = vpinsrd_avx(ZEXT416(*(uint *)(src + lVar7 * 3)),
                                   *(undefined4 *)(src + lVar7 * 4),1);
            auVar35 = vpmaddubsw_avx(auVar112,auVar75);
            auVar49 = vpunpcklbw_avx(auVar129,auVar133);
            uVar10 = *(uint *)(src + lVar7 * 4);
            auVar129 = vpaddw_avx(auVar35,auVar57);
            auVar129 = vpaddw_avx(auVar129,auVar69);
            auVar133 = vpmaddubsw_avx(auVar49,auVar46);
            auVar129 = vpaddw_avx(auVar133,auVar129);
            auVar129 = vpsraw_avx(auVar129,6);
            auVar129 = vpackuswb_avx(auVar129,auVar129);
            *(int *)dst = auVar129._0_4_;
            iVar18 = vpextrw_avx(auVar129,3);
            uVar21 = vpextrw_avx(auVar129,2);
            *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
            dst = dst + dst_stride * 2;
            src = src + lVar5;
            h = h + -2;
            auVar133 = auVar112;
            auVar112 = auVar49;
          } while (h != 0);
        }
      }
      else {
        auVar56 = vpshufb_avx(auVar46,_DAT_00561fc0);
        auVar40._0_2_ = auVar56._0_2_;
        auVar40._2_2_ = auVar40._0_2_;
        auVar40._4_2_ = auVar40._0_2_;
        auVar40._6_2_ = auVar40._0_2_;
        auVar40._8_2_ = auVar40._0_2_;
        auVar40._10_2_ = auVar40._0_2_;
        auVar40._12_2_ = auVar40._0_2_;
        auVar40._14_2_ = auVar40._0_2_;
        auVar40._16_2_ = auVar40._0_2_;
        auVar40._18_2_ = auVar40._0_2_;
        auVar40._20_2_ = auVar40._0_2_;
        auVar40._22_2_ = auVar40._0_2_;
        auVar40._24_2_ = auVar40._0_2_;
        auVar40._26_2_ = auVar40._0_2_;
        auVar40._28_2_ = auVar40._0_2_;
        auVar40._30_2_ = auVar40._0_2_;
        auVar56 = vpshufb_avx(auVar46,_DAT_00561fd0);
        auVar54._0_2_ = auVar56._0_2_;
        auVar54._2_2_ = auVar54._0_2_;
        auVar54._4_2_ = auVar54._0_2_;
        auVar54._6_2_ = auVar54._0_2_;
        auVar54._8_2_ = auVar54._0_2_;
        auVar54._10_2_ = auVar54._0_2_;
        auVar54._12_2_ = auVar54._0_2_;
        auVar54._14_2_ = auVar54._0_2_;
        auVar54._16_2_ = auVar54._0_2_;
        auVar54._18_2_ = auVar54._0_2_;
        auVar54._20_2_ = auVar54._0_2_;
        auVar54._22_2_ = auVar54._0_2_;
        auVar54._24_2_ = auVar54._0_2_;
        auVar54._26_2_ = auVar54._0_2_;
        auVar54._28_2_ = auVar54._0_2_;
        auVar54._30_2_ = auVar54._0_2_;
        auVar46 = vpshufb_avx(auVar46,_DAT_00561fe0);
        auVar64._0_2_ = auVar46._0_2_;
        auVar64._2_2_ = auVar64._0_2_;
        auVar64._4_2_ = auVar64._0_2_;
        auVar64._6_2_ = auVar64._0_2_;
        auVar64._8_2_ = auVar64._0_2_;
        auVar64._10_2_ = auVar64._0_2_;
        auVar64._12_2_ = auVar64._0_2_;
        auVar64._14_2_ = auVar64._0_2_;
        auVar64._16_2_ = auVar64._0_2_;
        auVar64._18_2_ = auVar64._0_2_;
        auVar64._20_2_ = auVar64._0_2_;
        auVar64._22_2_ = auVar64._0_2_;
        auVar64._24_2_ = auVar64._0_2_;
        auVar64._26_2_ = auVar64._0_2_;
        auVar64._28_2_ = auVar64._0_2_;
        auVar64._30_2_ = auVar64._0_2_;
        if (w == 8) {
          lVar7 = (long)src_stride;
          uVar9 = *(ulong *)(*pauVar4 + lVar7 * 4);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)(*pauVar4 + lVar7);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)*pauVar4;
          auVar95._0_16_ = ZEXT116(0) * auVar103 + ZEXT116(1) * auVar87;
          auVar95._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)src;
          auVar110._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar103;
          auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar114;
          auVar53 = vpunpcklbw_avx2(auVar95,auVar110);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)(*pauVar4 + lVar7 * 3);
          auVar116._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar114;
          auVar116._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar9;
          auVar96._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar88;
          auVar96._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
          auVar90 = vpunpcklbw_avx2(auVar116,auVar96);
          auVar97._8_2_ = 0x20;
          auVar97._0_8_ = 0x20002000200020;
          auVar97._10_2_ = 0x20;
          auVar97._12_2_ = 0x20;
          auVar97._14_2_ = 0x20;
          auVar97._16_2_ = 0x20;
          auVar97._18_2_ = 0x20;
          auVar97._20_2_ = 0x20;
          auVar97._22_2_ = 0x20;
          auVar97._24_2_ = 0x20;
          auVar97._26_2_ = 0x20;
          auVar97._28_2_ = 0x20;
          auVar97._30_2_ = 0x20;
          do {
            auVar53 = vpmaddubsw_avx2(auVar53,auVar40);
            auVar104._8_8_ = 0;
            auVar104._0_8_ = *(ulong *)(src + lVar7 * 3);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar9;
            auVar131._0_16_ = ZEXT116(0) * auVar104 + ZEXT116(1) * auVar71;
            auVar131._16_16_ = ZEXT116(1) * auVar104;
            uVar9 = *(ulong *)(src + lVar7 * 4);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar9;
            auVar139._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar104;
            auVar139._16_16_ = ZEXT116(1) * auVar72;
            auVar94 = vpmaddubsw_avx2(auVar90,auVar54);
            auVar66 = vpunpcklbw_avx2(auVar131,auVar139);
            auVar53 = vpaddw_avx2(auVar94,auVar53);
            auVar53 = vpaddw_avx2(auVar53,auVar97);
            auVar94 = vpmaddubsw_avx2(auVar66,auVar64);
            auVar53 = vpaddw_avx2(auVar94,auVar53);
            auVar53 = vpsraw_avx2(auVar53,6);
            auVar53 = vpackuswb_avx2(auVar53,auVar40);
            *(long *)dst = auVar53._0_8_;
            *(long *)(dst + dst_stride) = auVar53._16_8_;
            dst = dst + dst_stride * 2;
            src = src + lVar5;
            h = h + -2;
            auVar53 = auVar90;
            auVar90 = auVar66;
          } while (h != 0);
        }
        else if (w == 0x10) {
          lVar7 = (long)src_stride;
          auVar46 = *(undefined1 (*) [16])(*pauVar4 + lVar7);
          auVar56 = *(undefined1 (*) [16])src;
          auVar75 = *(undefined1 (*) [16])(*pauVar4 + lVar7 * 3);
          auVar112 = *(undefined1 (*) [16])(*pauVar4 + lVar7 * 4);
          auVar91._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * *pauVar4;
          auVar91._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
          auVar106._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar46;
          auVar106._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
          auVar136._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar56;
          auVar136._16_16_ = ZEXT116(1) * auVar75;
          auVar126._0_16_ = ZEXT116(0) * auVar112 + ZEXT116(1) * auVar75;
          auVar126._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar112;
          auVar94 = vpunpcklbw_avx2(auVar91,auVar106);
          auVar66 = vpunpcklbw_avx2(auVar136,auVar126);
          auVar53 = vpunpckhbw_avx2(auVar91,auVar106);
          auVar90 = vpunpckhbw_avx2(auVar136,auVar126);
          auVar92._8_2_ = 0x20;
          auVar92._0_8_ = 0x20002000200020;
          auVar92._10_2_ = 0x20;
          auVar92._12_2_ = 0x20;
          auVar92._14_2_ = 0x20;
          auVar92._16_2_ = 0x20;
          auVar92._18_2_ = 0x20;
          auVar92._20_2_ = 0x20;
          auVar92._22_2_ = 0x20;
          auVar92._24_2_ = 0x20;
          auVar92._26_2_ = 0x20;
          auVar92._28_2_ = 0x20;
          auVar92._30_2_ = 0x20;
          do {
            auVar94 = vpmaddubsw_avx2(auVar94,auVar40);
            auVar78 = vpmaddubsw_avx2(auVar53,auVar40);
            auVar46 = *(undefined1 (*) [16])(src + lVar7 * 3);
            auVar143._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar112;
            auVar143._16_16_ = ZEXT116(1) * auVar46;
            auVar112 = *(undefined1 (*) [16])(src + lVar7 * 4);
            auVar146._0_16_ = ZEXT116(0) * auVar112 + ZEXT116(1) * auVar46;
            auVar146._16_16_ = ZEXT116(1) * auVar112;
            auVar53 = vpmaddubsw_avx2(auVar66,auVar54);
            auVar118 = vpunpcklbw_avx2(auVar143,auVar146);
            auVar137 = vpmaddubsw_avx2(auVar90,auVar54);
            auVar127 = vpunpckhbw_avx2(auVar143,auVar146);
            auVar53 = vpaddw_avx2(auVar94,auVar53);
            auVar39 = vpmaddubsw_avx2(auVar118,auVar64);
            auVar94 = vpaddw_avx2(auVar78,auVar137);
            auVar78 = vpmaddubsw_avx2(auVar127,auVar64);
            auVar53 = vpaddw_avx2(auVar53,auVar92);
            auVar53 = vpaddw_avx2(auVar53,auVar39);
            auVar137 = vpsraw_avx2(auVar53,6);
            auVar53 = vpaddw_avx2(auVar94,auVar92);
            auVar53 = vpaddw_avx2(auVar53,auVar78);
            auVar53 = vpsraw_avx2(auVar53,6);
            auVar53 = vpackuswb_avx2(auVar137,auVar53);
            *(undefined1 (*) [16])dst = auVar53._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar53._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            src = src + lVar5;
            h = h + -2;
            auVar53 = auVar90;
            auVar94 = auVar66;
            auVar90 = auVar127;
            auVar66 = auVar118;
          } while (h != 0);
        }
        else {
          lVar7 = (long)src_stride;
          puVar6 = src + lVar7 * 4;
          puVar19 = src + lVar7 * 3;
          uVar9 = 0;
          auVar98._8_2_ = 0x20;
          auVar98._0_8_ = 0x20002000200020;
          auVar98._10_2_ = 0x20;
          auVar98._12_2_ = 0x20;
          auVar98._14_2_ = 0x20;
          auVar98._16_2_ = 0x20;
          auVar98._18_2_ = 0x20;
          auVar98._20_2_ = 0x20;
          auVar98._22_2_ = 0x20;
          auVar98._24_2_ = 0x20;
          auVar98._26_2_ = 0x20;
          auVar98._28_2_ = 0x20;
          auVar98._30_2_ = 0x20;
          do {
            pauVar15 = (undefined1 (*) [32])(dst + uVar9);
            auVar53 = *(undefined1 (*) [32])(*pauVar4 + lVar7 + uVar9);
            auVar90 = *(undefined1 (*) [32])(*pauVar4 + lVar5 + uVar9);
            auVar94 = *(undefined1 (*) [32])(*pauVar4 + lVar7 * 3 + uVar9);
            auVar66 = *(undefined1 (*) [32])(*pauVar4 + lVar7 * 4 + uVar9);
            auVar39 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar9),auVar53);
            auVar82 = vpunpcklbw_avx2(auVar90,auVar94);
            auVar78 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar9),auVar53);
            auVar137 = vpunpckhbw_avx2(auVar90,auVar94);
            auVar127 = vpunpcklbw_avx2(auVar53,auVar90);
            auVar118 = vpunpcklbw_avx2(auVar94,auVar66);
            auVar53 = vpunpckhbw_avx2(auVar53,auVar90);
            auVar90 = vpunpckhbw_avx2(auVar94,auVar66);
            lVar11 = 0;
            iVar22 = h;
            do {
              auVar111 = auVar118;
              auVar61 = auVar90;
              auVar83 = auVar137;
              auVar127 = vpmaddubsw_avx2(auVar127,auVar40);
              auVar118 = vpmaddubsw_avx2(auVar53,auVar40);
              auVar90 = vpmaddubsw_avx2(auVar39,auVar40);
              auVar94 = vpmaddubsw_avx2(auVar78,auVar40);
              auVar53 = *(undefined1 (*) [32])(puVar19 + lVar11);
              auVar78 = vpmaddubsw_avx2(auVar82,auVar54);
              auVar117 = vpunpcklbw_avx2(auVar66,auVar53);
              auVar90 = vpaddw_avx2(auVar90,auVar78);
              auVar78 = vpmaddubsw_avx2(auVar83,auVar54);
              auVar137 = vpunpckhbw_avx2(auVar66,auVar53);
              auVar94 = vpaddw_avx2(auVar94,auVar78);
              auVar66 = vpmaddubsw_avx2(auVar111,auVar54);
              auVar78 = vpaddw_avx2(auVar127,auVar66);
              auVar66 = vpmaddubsw_avx2(auVar61,auVar54);
              auVar39 = vpaddw_avx2(auVar118,auVar66);
              auVar66 = vpmaddubsw_avx2(auVar117,auVar64);
              auVar90 = vpaddw_avx2(auVar90,auVar98);
              auVar90 = vpaddw_avx2(auVar90,auVar66);
              auVar66 = vpmaddubsw_avx2(auVar137,auVar64);
              auVar94 = vpaddw_avx2(auVar94,auVar98);
              auVar94 = vpaddw_avx2(auVar94,auVar66);
              auVar66 = *(undefined1 (*) [32])(puVar6 + lVar11);
              auVar127 = vpsraw_avx2(auVar90,6);
              auVar90 = vpsraw_avx2(auVar94,6);
              auVar94 = vpackuswb_avx2(auVar127,auVar90);
              auVar118 = vpunpcklbw_avx2(auVar53,auVar66);
              auVar90 = vpunpckhbw_avx2(auVar53,auVar66);
              *pauVar15 = auVar94;
              auVar94 = vpmaddubsw_avx2(auVar118,auVar64);
              auVar53 = vpaddw_avx2(auVar78,auVar98);
              auVar53 = vpaddw_avx2(auVar53,auVar94);
              auVar78 = vpmaddubsw_avx2(auVar90,auVar64);
              auVar94 = vpaddw_avx2(auVar39,auVar98);
              auVar94 = vpaddw_avx2(auVar94,auVar78);
              auVar53 = vpsraw_avx2(auVar53,6);
              auVar94 = vpsraw_avx2(auVar94,6);
              auVar53 = vpackuswb_avx2(auVar53,auVar94);
              *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar53;
              pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
              lVar11 = lVar11 + lVar5;
              iVar22 = iVar22 + -2;
              auVar39 = auVar82;
              auVar82 = auVar117;
              auVar78 = auVar83;
              auVar127 = auVar111;
              auVar53 = auVar61;
            } while (iVar22 != 0);
            uVar9 = uVar9 + 0x20;
            puVar6 = puVar6 + 0x20;
            puVar19 = puVar19 + 0x20;
          } while (uVar9 < (uint)w);
        }
      }
    }
  }
  else {
    lVar5 = (long)(src_stride * 3);
    pauVar4 = (undefined1 (*) [16])(src + -lVar5);
    auVar46 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar9),1);
    if (w < 5) {
      auVar56 = vpshufb_avx(auVar46,_DAT_0050d6a0);
      auVar75 = vpshufb_avx(auVar46,_DAT_0050d6f0);
      auVar112 = vpshufb_avx(auVar46,_DAT_0050d6c0);
      auVar46 = vpshufb_avx(auVar46,_DAT_0050d700);
      if (w == 2) {
        lVar5 = (long)src_stride;
        uVar10 = (uint)*(short *)(*pauVar4 + lVar5 * 6);
        auVar129 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar4),
                                  ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5)));
        auVar133 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5)),
                                  ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 2)));
        auVar129 = vpunpcklbw_avx(auVar129,auVar133);
        auVar133 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 2)),
                                  ZEXT416((uint)(int)*(short *)src));
        auVar57 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                 ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 4)));
        auVar133 = vpunpcklbw_avx(auVar133,auVar57);
        auVar57 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 4)),
                                 ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 5)));
        auVar35 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 5)),
                                 ZEXT416(uVar10));
        auVar57 = vpunpcklbw_avx(auVar57,auVar35);
        auVar121._8_2_ = 0x20;
        auVar121._0_8_ = 0x20002000200020;
        auVar121._10_2_ = 0x20;
        auVar121._12_2_ = 0x20;
        auVar121._14_2_ = 0x20;
        do {
          auVar129 = vpmaddubsw_avx(auVar129,auVar56);
          auVar35 = vpmaddubsw_avx(auVar133,auVar75);
          auVar49 = vpunpcklwd_avx(ZEXT416(uVar10),
                                   ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 7)));
          uVar10 = (uint)*(short *)(*pauVar4 + lVar5 * 8);
          auVar58 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar4 + lVar5 * 7)),
                                   ZEXT416(uVar10));
          auVar49 = vpunpcklbw_avx(auVar49,auVar58);
          auVar129 = vpaddw_avx(auVar129,auVar35);
          auVar35 = vpmaddubsw_avx(auVar57,auVar112);
          auVar129 = vpaddw_avx(auVar129,auVar35);
          auVar129 = vpaddw_avx(auVar129,auVar121);
          auVar35 = vpmaddubsw_avx(auVar49,auVar46);
          auVar129 = vpaddw_avx(auVar129,auVar35);
          auVar129 = vpsraw_avx(auVar129,6);
          auVar129 = vpackuswb_avx(auVar129,auVar129);
          vpextrw_avx(auVar129,0);
          vpextrw_avx(auVar129,1);
          pauVar4 = (undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
          h = h + -2;
          auVar129 = auVar133;
          auVar133 = auVar57;
          auVar57 = auVar49;
        } while (h != 0);
      }
      else {
        lVar5 = (long)src_stride;
        auVar129 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar4),*(uint *)(*pauVar4 + lVar5),1);
        auVar133 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar5)),*(uint *)(*pauVar4 + lVar5 * 2),
                               1);
        auVar57 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar5 * 2)),*(uint *)src,1);
        uVar10 = *(uint *)(*pauVar4 + lVar5 * 6);
        auVar35 = vpinsrd_avx(ZEXT416(*(uint *)src),*(uint *)(*pauVar4 + lVar5 * 4),1);
        auVar49 = vpunpcklbw_avx(auVar129,auVar133);
        auVar129 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar5 * 4)),
                               *(uint *)(*pauVar4 + lVar5 * 5),1);
        auVar57 = vpunpcklbw_avx(auVar57,auVar35);
        auVar133 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar5 * 5)),
                               *(undefined4 *)(*pauVar4 + lVar5 * 6),1);
        auVar129 = vpunpcklbw_avx(auVar129,auVar133);
        auVar113._8_2_ = 0x20;
        auVar113._0_8_ = 0x20002000200020;
        auVar113._10_2_ = 0x20;
        auVar113._12_2_ = 0x20;
        auVar113._14_2_ = 0x20;
        do {
          auVar58 = auVar129;
          auVar35 = vpmaddubsw_avx(auVar49,auVar56);
          auVar49 = vpmaddubsw_avx(auVar57,auVar75);
          auVar129 = vpinsrd_avx(ZEXT416(uVar10),*(uint *)(*pauVar4 + lVar5 * 7),1);
          auVar133 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar4 + lVar5 * 7)),
                                 *(undefined4 *)(*pauVar4 + lVar5 * 8),1);
          auVar129 = vpunpcklbw_avx(auVar129,auVar133);
          uVar10 = *(uint *)(*pauVar4 + lVar5 * 8);
          auVar133 = vpaddw_avx(auVar35,auVar49);
          auVar35 = vpmaddubsw_avx(auVar58,auVar112);
          auVar133 = vpaddw_avx(auVar133,auVar35);
          auVar133 = vpaddw_avx(auVar133,auVar113);
          auVar35 = vpmaddubsw_avx(auVar129,auVar46);
          auVar133 = vpaddw_avx(auVar133,auVar35);
          auVar133 = vpsraw_avx(auVar133,6);
          auVar133 = vpackuswb_avx(auVar133,auVar133);
          *(int *)dst = auVar133._0_4_;
          iVar18 = vpextrw_avx(auVar133,3);
          uVar21 = vpextrw_avx(auVar133,2);
          *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
          pauVar4 = (undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
          auVar49 = auVar57;
          auVar57 = auVar58;
        } while (h != 0);
      }
    }
    else {
      auVar56 = vpshufb_avx(auVar46,_DAT_00562000);
      uVar25 = auVar56._0_2_;
      auVar63._2_2_ = uVar25;
      auVar63._0_2_ = uVar25;
      auVar63._4_2_ = uVar25;
      auVar63._6_2_ = uVar25;
      auVar63._8_2_ = uVar25;
      auVar63._10_2_ = uVar25;
      auVar63._12_2_ = uVar25;
      auVar63._14_2_ = uVar25;
      auVar63._16_2_ = uVar25;
      auVar63._18_2_ = uVar25;
      auVar63._20_2_ = uVar25;
      auVar63._22_2_ = uVar25;
      auVar63._24_2_ = uVar25;
      auVar63._26_2_ = uVar25;
      auVar63._28_2_ = uVar25;
      auVar63._30_2_ = uVar25;
      auVar56 = vpshufb_avx(auVar46,_DAT_00561f60);
      uVar25 = auVar56._0_2_;
      auVar153._2_2_ = uVar25;
      auVar153._0_2_ = uVar25;
      auVar153._4_2_ = uVar25;
      auVar153._6_2_ = uVar25;
      auVar153._8_2_ = uVar25;
      auVar153._10_2_ = uVar25;
      auVar153._12_2_ = uVar25;
      auVar153._14_2_ = uVar25;
      auVar153._16_2_ = uVar25;
      auVar153._18_2_ = uVar25;
      auVar153._20_2_ = uVar25;
      auVar153._22_2_ = uVar25;
      auVar153._24_2_ = uVar25;
      auVar153._26_2_ = uVar25;
      auVar153._28_2_ = uVar25;
      auVar153._30_2_ = uVar25;
      auVar56 = vpshufb_avx(auVar46,_DAT_00561f70);
      uVar25 = auVar56._0_2_;
      auVar148._2_2_ = uVar25;
      auVar148._0_2_ = uVar25;
      auVar148._4_2_ = uVar25;
      auVar148._6_2_ = uVar25;
      auVar148._8_2_ = uVar25;
      auVar148._10_2_ = uVar25;
      auVar148._12_2_ = uVar25;
      auVar148._14_2_ = uVar25;
      auVar148._16_2_ = uVar25;
      auVar148._18_2_ = uVar25;
      auVar148._20_2_ = uVar25;
      auVar148._22_2_ = uVar25;
      auVar148._24_2_ = uVar25;
      auVar148._26_2_ = uVar25;
      auVar148._28_2_ = uVar25;
      auVar148._30_2_ = uVar25;
      auVar46 = vpshufb_avx(auVar46,_DAT_00562010);
      uVar25 = auVar46._0_2_;
      auVar151._2_2_ = uVar25;
      auVar151._0_2_ = uVar25;
      auVar151._4_2_ = uVar25;
      auVar151._6_2_ = uVar25;
      auVar151._8_2_ = uVar25;
      auVar151._10_2_ = uVar25;
      auVar151._12_2_ = uVar25;
      auVar151._14_2_ = uVar25;
      auVar151._16_2_ = uVar25;
      auVar151._18_2_ = uVar25;
      auVar151._20_2_ = uVar25;
      auVar151._22_2_ = uVar25;
      auVar151._24_2_ = uVar25;
      auVar151._26_2_ = uVar25;
      auVar151._28_2_ = uVar25;
      auVar151._30_2_ = uVar25;
      if (w == 8) {
        lVar5 = (long)src_stride;
        uVar9 = *(ulong *)(*pauVar4 + lVar5 * 6);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(*pauVar4 + lVar5);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)*pauVar4;
        auVar41._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar31;
        auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = *(ulong *)(*pauVar4 + lVar5 * 2);
        auVar55._0_16_ = ZEXT116(0) * auVar102 + ZEXT116(1) * auVar48;
        auVar55._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar102;
        auVar53 = vpunpcklbw_avx2(auVar41,auVar55);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)src;
        auVar107._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar102;
        auVar107._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = *(ulong *)(*pauVar4 + lVar5 * 4);
        auVar42._0_16_ = ZEXT116(0) * auVar122 + ZEXT116(1) * auVar32;
        auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar122;
        auVar90 = vpunpcklbw_avx2(auVar107,auVar42);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(*pauVar4 + lVar5 * 5);
        auVar108._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar122;
        auVar108._16_16_ = ZEXT116(1) * auVar33;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar9;
        auVar43._0_16_ = ZEXT116(0) * auVar84 + ZEXT116(1) * auVar33;
        auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar84;
        auVar94 = vpunpcklbw_avx2(auVar108,auVar43);
        auVar109._8_2_ = 0x20;
        auVar109._0_8_ = 0x20002000200020;
        auVar109._10_2_ = 0x20;
        auVar109._12_2_ = 0x20;
        auVar109._14_2_ = 0x20;
        auVar109._16_2_ = 0x20;
        auVar109._18_2_ = 0x20;
        auVar109._20_2_ = 0x20;
        auVar109._22_2_ = 0x20;
        auVar109._24_2_ = 0x20;
        auVar109._26_2_ = 0x20;
        auVar109._28_2_ = 0x20;
        auVar109._30_2_ = 0x20;
        do {
          auVar78 = auVar94;
          auVar53 = vpmaddubsw_avx2(auVar53,auVar63);
          auVar66 = vpmaddubsw_avx2(auVar90,auVar153);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(*pauVar4 + lVar5 * 7);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar9;
          auVar138._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar85;
          auVar138._16_16_ = ZEXT116(1) * auVar34;
          uVar9 = *(ulong *)(*pauVar4 + lVar5 * 8);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar9;
          auVar44._0_16_ = ZEXT116(0) * auVar86 + ZEXT116(1) * auVar34;
          auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar86;
          auVar94 = vpunpcklbw_avx2(auVar138,auVar44);
          auVar53 = vpaddw_avx2(auVar66,auVar53);
          auVar66 = vpmaddubsw_avx2(auVar78,auVar148);
          auVar53 = vpaddw_avx2(auVar66,auVar53);
          auVar53 = vpaddw_avx2(auVar53,auVar109);
          auVar66 = vpmaddubsw_avx2(auVar94,auVar151);
          auVar53 = vpaddw_avx2(auVar66,auVar53);
          auVar53 = vpsraw_avx2(auVar53,6);
          auVar53 = vpackuswb_avx2(auVar53,auVar94);
          *(long *)dst = auVar53._0_8_;
          *(long *)(dst + dst_stride) = auVar53._16_8_;
          pauVar4 = (undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
          auVar53 = auVar90;
          auVar90 = auVar78;
        } while (h != 0);
      }
      else if (w == 0x10) {
        lVar5 = (long)src_stride;
        auVar46 = *(undefined1 (*) [16])(*pauVar4 + lVar5);
        auVar56 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
        auVar75 = *(undefined1 (*) [16])src;
        auVar112 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 4);
        auVar129 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 5);
        auVar133 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 6);
        auVar38._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * *pauVar4;
        auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
        auVar52._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar46;
        auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
        auVar135._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar56;
        auVar135._16_16_ = ZEXT116(1) * auVar75;
        auVar115._0_16_ = ZEXT116(0) * auVar112 + ZEXT116(1) * auVar75;
        auVar115._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar112;
        auVar124._0_16_ = ZEXT116(0) * auVar129 + ZEXT116(1) * auVar112;
        auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar129;
        auVar145._0_16_ = ZEXT116(0) * auVar133 + ZEXT116(1) * auVar129;
        auVar145._16_16_ = ZEXT116(1) * auVar133;
        auVar66 = vpunpcklbw_avx2(auVar38,auVar52);
        auVar78 = vpunpcklbw_avx2(auVar135,auVar115);
        auVar137 = vpunpcklbw_avx2(auVar124,auVar145);
        auVar53 = vpunpckhbw_avx2(auVar38,auVar52);
        auVar90 = vpunpckhbw_avx2(auVar135,auVar115);
        auVar94 = vpunpckhbw_avx2(auVar124,auVar145);
        local_1c8._8_2_ = 0x20;
        local_1c8._0_8_ = 0x20002000200020;
        local_1c8._10_2_ = 0x20;
        local_1c8._12_2_ = 0x20;
        local_1c8._14_2_ = 0x20;
        local_1c8._16_2_ = 0x20;
        local_1c8._18_2_ = 0x20;
        local_1c8._20_2_ = 0x20;
        local_1c8._22_2_ = 0x20;
        local_1c8._24_2_ = 0x20;
        local_1c8._26_2_ = 0x20;
        local_1c8._28_2_ = 0x20;
        local_1c8._30_2_ = 0x20;
        do {
          auVar83 = auVar137;
          auVar66 = vpmaddubsw_avx2(auVar66,auVar63);
          auVar39 = vpmaddubsw_avx2(auVar78,auVar153);
          auVar127 = vpmaddubsw_avx2(auVar53,auVar63);
          auVar118 = vpmaddubsw_avx2(auVar90,auVar153);
          auVar46 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 7);
          auVar152._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar133;
          auVar152._16_16_ = ZEXT116(1) * auVar46;
          auVar133 = *(undefined1 (*) [16])(*pauVar4 + lVar5 * 8);
          auVar125._0_16_ = ZEXT116(0) * auVar133 + ZEXT116(1) * auVar46;
          auVar125._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar133;
          auVar137 = vpunpcklbw_avx2(auVar152,auVar125);
          auVar82 = vpunpckhbw_avx2(auVar152,auVar125);
          auVar53 = vpaddw_avx2(auVar66,auVar39);
          auVar66 = vpmaddubsw_avx2(auVar83,auVar148);
          auVar53 = vpaddw_avx2(auVar53,auVar66);
          auVar39 = vpmaddubsw_avx2(auVar137,auVar151);
          auVar66 = vpaddw_avx2(auVar127,auVar118);
          auVar127 = vpmaddubsw_avx2(auVar94,auVar148);
          auVar66 = vpaddw_avx2(auVar66,auVar127);
          auVar127 = vpmaddubsw_avx2(auVar82,auVar151);
          auVar53 = vpaddw_avx2(local_1c8,auVar53);
          auVar53 = vpaddw_avx2(auVar53,auVar39);
          auVar39 = vpsraw_avx2(auVar53,6);
          auVar53 = vpaddw_avx2(auVar66,local_1c8);
          auVar53 = vpaddw_avx2(auVar127,auVar53);
          auVar53 = vpsraw_avx2(auVar53,6);
          auVar53 = vpackuswb_avx2(auVar39,auVar53);
          *(undefined1 (*) [16])dst = auVar53._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar53._16_16_;
          pauVar4 = (undefined1 (*) [16])(*pauVar4 + lVar5 * 2);
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          h = h + -2;
          auVar53 = auVar90;
          auVar66 = auVar78;
          auVar90 = auVar94;
          auVar94 = auVar82;
          auVar78 = auVar83;
        } while (h != 0);
      }
      else {
        lVar11 = (long)src_stride;
        lVar7 = lVar11 * 8 - lVar5;
        lVar12 = lVar11 * 7 - lVar5;
        uVar9 = 0;
        auVar100 = ZEXT3264(CONCAT230(0x20,CONCAT228(0x20,CONCAT226(0x20,CONCAT224(0x20,CONCAT222(
                                                  0x20,CONCAT220(0x20,CONCAT218(0x20,CONCAT216(0x20,
                                                  CONCAT214(0x20,CONCAT212(0x20,CONCAT210(0x20,
                                                  CONCAT28(0x20,0x20002000200020)))))))))))));
        do {
          pauVar15 = (undefined1 (*) [32])(dst + uVar9);
          auVar53 = *(undefined1 (*) [32])(*pauVar4 + lVar11 + uVar9);
          auVar90 = *(undefined1 (*) [32])(*pauVar4 + lVar11 * 2 + uVar9);
          auVar94 = *(undefined1 (*) [32])(*pauVar4 + lVar5 + uVar9);
          auVar66 = *(undefined1 (*) [32])(*pauVar4 + lVar11 * 4 + uVar9);
          auVar78 = *(undefined1 (*) [32])(*pauVar4 + lVar11 * 5 + uVar9);
          auVar137 = *(undefined1 (*) [32])(*pauVar4 + lVar11 * 6 + uVar9);
          auVar118 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar9),auVar53);
          local_1c8 = vpunpcklbw_avx2(auVar90,auVar94);
          auVar82 = vpunpcklbw_avx2(auVar66,auVar78);
          auVar39 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar9),auVar53);
          local_b8 = vpunpckhbw_avx2(auVar90,auVar94);
          auVar127 = vpunpckhbw_avx2(auVar66,auVar78);
          auVar83 = vpunpcklbw_avx2(auVar53,auVar90);
          auVar61 = vpunpcklbw_avx2(auVar94,auVar66);
          auVar111 = vpunpcklbw_avx2(auVar78,auVar137);
          auVar53 = vpunpckhbw_avx2(auVar53,auVar90);
          local_178 = vpunpckhbw_avx2(auVar94,auVar66);
          auVar90 = vpunpckhbw_avx2(auVar78,auVar137);
          puVar6 = src;
          iVar22 = h;
          do {
            auVar80 = auVar127;
            auVar81 = auVar90;
            auVar99 = auVar82;
            auVar66 = vpmaddubsw_avx2(auVar83,auVar63);
            auVar78 = vpmaddubsw_avx2(auVar61,auVar153);
            auVar83 = vpmaddubsw_avx2(auVar53,auVar63);
            auVar93 = auVar100._0_32_;
            auVar117 = vpmaddubsw_avx2(local_178,auVar153);
            auVar53 = vpmaddubsw_avx2(auVar118,auVar63);
            auVar90 = vpmaddubsw_avx2(local_1c8,auVar153);
            auVar94 = vpmaddubsw_avx2(auVar39,auVar63);
            auVar53 = vpaddw_avx2(auVar53,auVar90);
            auVar90 = vpmaddubsw_avx2(auVar99,auVar148);
            auVar90 = vpaddw_avx2(auVar53,auVar90);
            auVar53 = vpmaddubsw_avx2(local_b8,auVar153);
            auVar53 = vpaddw_avx2(auVar53,auVar94);
            auVar94 = vpmaddubsw_avx2(auVar80,auVar148);
            auVar94 = vpaddw_avx2(auVar53,auVar94);
            auVar53 = *(undefined1 (*) [32])(puVar6 + lVar12);
            auVar66 = vpaddw_avx2(auVar66,auVar78);
            auVar78 = vpmaddubsw_avx2(auVar111,auVar148);
            auVar66 = vpaddw_avx2(auVar66,auVar78);
            auVar82 = vpunpcklbw_avx2(auVar137,auVar53);
            auVar127 = vpunpckhbw_avx2(auVar137,auVar53);
            auVar78 = vpaddw_avx2(auVar117,auVar83);
            auVar137 = vpmaddubsw_avx2(auVar81,auVar148);
            auVar78 = vpaddw_avx2(auVar78,auVar137);
            auVar137 = vpmaddubsw_avx2(auVar82,auVar151);
            auVar90 = vpaddw_avx2(auVar90,auVar93);
            auVar90 = vpaddw_avx2(auVar90,auVar137);
            auVar137 = vpmaddubsw_avx2(auVar127,auVar151);
            auVar94 = vpaddw_avx2(auVar94,auVar93);
            auVar94 = vpaddw_avx2(auVar94,auVar137);
            auVar137 = *(undefined1 (*) [32])(puVar6 + lVar7);
            auVar90 = vpsraw_avx2(auVar90,6);
            auVar94 = vpsraw_avx2(auVar94,6);
            auVar94 = vpackuswb_avx2(auVar90,auVar94);
            auVar100 = ZEXT3264(auVar93);
            auVar117 = vpunpcklbw_avx2(auVar53,auVar137);
            auVar90 = vpunpckhbw_avx2(auVar53,auVar137);
            *pauVar15 = auVar94;
            auVar94 = vpmaddubsw_avx2(auVar117,auVar151);
            auVar53 = vpaddw_avx2(auVar66,auVar93);
            auVar53 = vpaddw_avx2(auVar53,auVar94);
            auVar66 = vpmaddubsw_avx2(auVar90,auVar151);
            auVar94 = vpaddw_avx2(auVar78,auVar93);
            auVar94 = vpaddw_avx2(auVar94,auVar66);
            auVar53 = vpsraw_avx2(auVar53,6);
            auVar94 = vpsraw_avx2(auVar94,6);
            auVar53 = vpackuswb_avx2(auVar53,auVar94);
            *(undefined1 (*) [32])(*pauVar15 + dst_stride) = auVar53;
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + dst_stride * 2);
            puVar6 = puVar6 + lVar11 * 2;
            iVar22 = iVar22 + -2;
            auVar83 = auVar61;
            auVar53 = local_178;
            auVar39 = local_b8;
            auVar61 = auVar111;
            auVar118 = local_1c8;
            auVar111 = auVar117;
            local_1c8 = auVar99;
            local_178 = auVar81;
            local_b8 = auVar80;
          } while (iVar22 != 0);
          uVar9 = uVar9 + 0x20;
          lVar7 = lVar7 + 0x20;
          lVar12 = lVar12 + 0x20;
        } while (uVar9 < (uint)w);
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_y_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_y,
                            const int32_t subpel_y_qn) {
#if CONFIG_SVT_AV1
  const int vert_tap = get_filter_tap(filter_params_y, subpel_y_qn);

  if (vert_tap == 12) {
    av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn);
  } else {
    av1_convolve_y_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_y, subpel_y_qn);
  }
#else
  av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_y, subpel_y_qn);
#endif
}